

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fepoll.cpp
# Opt level: O2

int __thiscall fepoll::update(fepoll *this,int timeout)

{
  long *plVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  epoll_event results [64];
  
  if (0 < this->epfd_) {
    uVar2 = epoll_wait(this->epfd_,(epoll_event *)results,0x40,timeout);
    uVar4 = 0;
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 * 0xc - uVar4 != 0; uVar4 = uVar4 + 0xc) {
      plVar1 = *(long **)((long)&results[0].data + uVar4);
      (**(code **)(*plVar1 + 0x10))(plVar1,*(undefined4 *)((long)&results[0].events + uVar4));
    }
    return uVar2;
  }
  __assert_fail("epfd_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/fepoll.cpp"
                ,0x26,"virtual int fepoll::update(int)");
}

Assistant:

int fepoll::update(int timeout)
{
    assert(epfd_ > 0);
    epoll_event results[64];
    int count = epoll_wait(epfd_, results, 64, timeout);
    for (int i = 0; i < count; i++)
    {
        unsigned int events = results[i].events;
        iobject* object = (iobject*)results[i].data.ptr;
        object->on_event(events);
    }
    return count;
}